

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O0

void __thiscall
neural_networks::NeuralNetwork::back_propogate
          (NeuralNetwork *this,vector<long_double,_std::allocator<long_double>_> *correct_data)

{
  longdouble lVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  const_reference ppNVar6;
  length_error *this_00;
  Matrix<long_double> *pMVar7;
  reference ppMVar8;
  reference pvVar9;
  reference ppNVar10;
  const_reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  undefined4 extraout_var;
  Matrix<long_double> *pMVar14;
  reference ppMVar15;
  vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
  *this_01;
  longdouble lVar16;
  longdouble lVar17;
  Matrix<long_double> **item;
  iterator __end1;
  iterator __begin1;
  vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
  *__range1;
  size_t k;
  size_t j;
  size_t i;
  longdouble del;
  Matrix<long_double> *wt;
  Matrix<long_double> *temp;
  size_t i_1;
  value_type local_48;
  undefined1 local_40 [8];
  vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
  error_vectors;
  vector<long_double,_std::allocator<long_double>_> *correct_data_local;
  NeuralNetwork *this_local;
  
  sVar4 = std::vector<long_double,_std::allocator<long_double>_>::size(correct_data);
  sVar5 = std::
          vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
          ::size(&this->layers);
  ppNVar6 = std::
            vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
            ::operator[](&this->layers,sVar5 - 1);
  if (sVar4 != ((*ppNVar6)->data->super_Matrix<neural_networks::utilities::Neuron_*>).N) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error
              (this_00,"Length of given dataset doesn\'t match up with output layer");
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  sVar4 = std::
          vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
          ::size(&this->layers);
  local_48 = (value_type)0x0;
  std::allocator<neural_networks::utilities::Matrix<long_double>_*>::allocator
            ((allocator<neural_networks::utilities::Matrix<long_double>_*> *)((long)&i_1 + 7));
  std::
  vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
  ::vector((vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
            *)local_40,sVar4,&local_48,
           (allocator<neural_networks::utilities::Matrix<long_double>_*> *)((long)&i_1 + 7));
  std::allocator<neural_networks::utilities::Matrix<long_double>_*>::~allocator
            ((allocator<neural_networks::utilities::Matrix<long_double>_*> *)((long)&i_1 + 7));
  sVar4 = std::
          vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
          ::size(&this->layers);
  ppNVar6 = std::
            vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
            ::operator[](&this->layers,sVar4 - 1);
  pMVar7 = utilities::matrix_operators::create((*ppNVar6)->data,function);
  sVar4 = std::
          vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
          ::size((vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                  *)local_40);
  ppMVar8 = std::
            vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
            ::operator[]((vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                          *)local_40,sVar4 - 1);
  *ppMVar8 = pMVar7;
  temp = (Matrix<long_double> *)0x0;
  while( true ) {
    pMVar7 = (Matrix<long_double> *)
             std::vector<long_double,_std::allocator<long_double>_>::size(correct_data);
    if (pMVar7 <= temp) break;
    this_01 = &this->layers;
    sVar4 = std::
            vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
            ::size(this_01);
    ppNVar6 = std::
              vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
              ::operator[](this_01,sVar4 - 1);
    pvVar9 = std::
             vector<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
             ::operator[](&((*ppNVar6)->data->super_Matrix<neural_networks::utilities::Neuron_*>).
                           matrix,(size_type)temp);
    ppNVar10 = std::
               vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
               ::operator[](pvVar9,0);
    lVar16 = (*ppNVar10)->function;
    pvVar11 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                        (correct_data,(size_type)temp);
    lVar17 = *(longdouble *)pvVar11;
    sVar4 = std::
            vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
            ::size(this_01);
    ppNVar6 = std::
              vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
              ::operator[](this_01,sVar4 - 1);
    pvVar9 = std::
             vector<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
             ::operator[](&((*ppNVar6)->data->super_Matrix<neural_networks::utilities::Neuron_*>).
                           matrix,(size_type)temp);
    ppNVar10 = std::
               vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
               ::operator[](pvVar9,0);
    lVar1 = (*ppNVar10)->function_derivative;
    sVar4 = std::
            vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
            ::size((vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                    *)local_40);
    ppMVar8 = std::
              vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
              ::operator[]((vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                            *)local_40,sVar4 - 1);
    pvVar12 = std::
              vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
              ::operator[](&(*ppMVar8)->matrix,(size_type)temp);
    pvVar13 = std::vector<long_double,_std::allocator<long_double>_>::operator[](pvVar12,0);
    *(longdouble *)pvVar13 = lVar1 * (lVar16 - lVar17);
    temp = (Matrix<long_double> *)((long)&temp->_vptr_Matrix + 1);
  }
  sVar4 = std::
          vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
          ::size((vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                  *)local_40);
  for (j = sVar4 - 2; j != 0; j = j - 1) {
    ppNVar6 = std::
              vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
              ::operator[](&this->layers,j + 1);
    iVar3 = (*(*ppNVar6)->weights->_vptr_Matrix[2])();
    pMVar7 = (Matrix<long_double> *)CONCAT44(extraout_var,iVar3);
    ppMVar8 = std::
              vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
              ::operator[]((vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                            *)local_40,j + 1);
    pMVar14 = utilities::Matrix<long_double>::operator*(pMVar7,*ppMVar8);
    for (k = 0; k < pMVar14->N; k = k + 1) {
      lVar16 = this->learning_rate;
      ppNVar6 = std::
                vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
                ::operator[](&this->layers,j);
      pvVar9 = std::
               vector<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
               ::operator[](&((*ppNVar6)->data->super_Matrix<neural_networks::utilities::Neuron_*>).
                             matrix,k);
      ppNVar10 = std::
                 vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
                 ::operator[](pvVar9,0);
      lVar17 = (*ppNVar10)->function_derivative;
      pvVar12 = std::
                vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                ::operator[](&pMVar14->matrix,k);
      pvVar13 = std::vector<long_double,_std::allocator<long_double>_>::operator[](pvVar12,0);
      lVar17 = *(longdouble *)pvVar13 * lVar17;
      *(longdouble *)pvVar13 = lVar17;
      lVar16 = lVar16 * lVar17;
      ppNVar6 = std::
                vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
                ::operator[](&this->layers,j);
      pvVar12 = std::
                vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                ::operator[](&(*ppNVar6)->bias->matrix,k);
      pvVar13 = std::vector<long_double,_std::allocator<long_double>_>::operator[](pvVar12,0);
      *(longdouble *)pvVar13 = *(longdouble *)pvVar13 - lVar16;
      __range1 = (vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                  *)0x0;
      while( true ) {
        ppNVar6 = std::
                  vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
                  ::operator[](&this->layers,j - 1);
        if ((vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
             *)((*ppNVar6)->data->super_Matrix<neural_networks::utilities::Neuron_*>).N <= __range1)
        break;
        ppNVar6 = std::
                  vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
                  ::operator[](&this->layers,j - 1);
        pvVar9 = std::
                 vector<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                 ::operator[](&((*ppNVar6)->data->super_Matrix<neural_networks::utilities::Neuron_*>
                               ).matrix,(size_type)__range1);
        ppNVar10 = std::
                   vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
                   ::operator[](pvVar9,0);
        lVar17 = (*ppNVar10)->data;
        ppNVar6 = std::
                  vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
                  ::operator[](&this->layers,j);
        pvVar12 = std::
                  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                  ::operator[](&(*ppNVar6)->weights->matrix,k);
        pvVar13 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                            (pvVar12,(size_type)__range1);
        *(longdouble *)pvVar13 = *(longdouble *)pvVar13 - lVar17 * lVar16;
        __range1 = (vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                    *)((long)&(__range1->
                              super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1);
      }
    }
    (*pMVar14->_vptr_Matrix[5])();
    ppMVar8 = std::
              vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
              ::operator[]((vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                            *)local_40,j);
    *ppMVar8 = pMVar14;
    if (pMVar7 != (Matrix<long_double> *)0x0) {
      (*pMVar7->_vptr_Matrix[4])();
    }
  }
  ppMVar8 = std::
            vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
            ::operator[]((vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                          *)local_40,0);
  if (*ppMVar8 != (value_type)0x0) {
    std::operator<<((ostream *)&std::cerr,"Error: the 0th index of error_vector non-null\n");
  }
  __end1 = std::
           vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
           ::begin((vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                    *)local_40);
  item = (Matrix<long_double> **)
         std::
         vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
         ::end((vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                *)local_40);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<neural_networks::utilities::Matrix<long_double>_**,_std::vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>_>
                                *)&item);
    if (!bVar2) break;
    ppMVar15 = __gnu_cxx::
               __normal_iterator<neural_networks::utilities::Matrix<long_double>_**,_std::vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>_>
               ::operator*(&__end1);
    if (*ppMVar15 != (Matrix<long_double> *)0x0) {
      (*(*ppMVar15)->_vptr_Matrix[4])();
    }
    __gnu_cxx::
    __normal_iterator<neural_networks::utilities::Matrix<long_double>_**,_std::vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
  ::~vector((vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
             *)local_40);
  return;
}

Assistant:

void NeuralNetwork::back_propogate(const std::vector<long double> &correct_data) const {
    // check to see if the given data set matches the size of the output vector
    if(correct_data.size() != layers[layers.size() - 1] -> data -> N) {
        throw std::length_error("Length of given dataset doesn't match up with output layer");
    }

    /* we need to amortize the error so we can quickly look it up later
    * the size that will actually be in use is layers.size() - 1 in practice but it makes it easier to access
    * I don't think there's any real reason to keep a vector of all the error vectors, since realistically
    * you're only going to be accessing the last ones, but it's nice to keep a reference of them anyway.
    * At some point the NeuralMatrix pointer will become a smart pointer and I'll be able to return these
    * without getting a bunch of cloggged up memory */
    std::vector< utilities::Matrix<long double> *> error_vectors(layers.size(), nullptr);
    // should create a copy of the last layer (output)
    // initialize last error vector to contain the values of the data vector's function
    error_vectors[error_vectors.size() - 1] =
            utilities::matrix_operators::create(layers[layers.size() - 1] -> data,
                                                utilities::matrix_operators::function);


    // data.size = length of output layer

    // loop creates the correct values for the error vector at the end
    for(register size_t i = 0; i < correct_data.size(); ++i) {
        error_vectors[error_vectors.size() - 1] -> matrix[i][0] =
                (layers[layers.size() - 1] -> data -> matrix[i][0] -> function - correct_data[i]) *
                layers[layers.size() - 1] -> data -> matrix[i][0] -> function_derivative;
    }
    utilities::Matrix<long double> *temp = NULL, *wt = NULL;
    long double del = 0;
    register size_t i = 0, j = 0, k = 0;
    // this loop performs the routine delta(l) = ((transpose(weight(l+1)) * delta(l+1)) * sigma'(z(l))
    for(i = error_vectors.size() - 2; i != 0; --i) {
        // here we have to get a copy of the transpose matrix
        wt = layers[i + 1] -> weights -> transpose();

        // this performs the matrix multiplication of weight(l+1)^T * delta(l+1)
        temp = *wt * error_vectors[i + 1];

        /* now that we have completed the matrix multiplication we'll need to actually compute the
         * element-wise product for ((w(l+1)^T) * delta(l+1)) (x) sigma'(z'(l)) */
        for(j = 0; j < temp -> N; ++j) {

            /* we'll set each individual element equal to the element wise product of the lefthand side and righthand
             * side of what should be two column vectors, we will update that value, save it, and then multiply it
             * by the learning rate, and save that as our del. This is what we'll subtract from the bias vector and
             * the weights matrix in order to back-propogate correctly
             */
            del = learning_rate * (temp -> matrix[j][0] *=
                                           layers[i] -> data -> matrix[j][0] -> function_derivative);
            // subtract the delta from the bias
            layers[i] -> bias -> matrix[j][0]-= del;
            // for the weight matrix, it's dC/d(w^(l)_{j,k}) = a^(l-1)_k * del(l)_j, so we have to multiply through
            // each value in order to update the weights matrix
            for(k = 0; k < layers[i - 1] -> data -> N; ++k) {
                layers[i] -> weights -> matrix[j][k] -= layers[i - 1] -> data -> matrix[k][0] -> data * del;
            }
        }
        temp -> print();
        /* finally, since we're done computing the hadamard product of the lefthand side and the righthand side
         * we place the temp pointer in our actual error_vectors vector and delete the transpose we used
         */
        error_vectors[i] = temp;
        delete wt;
    }
    // to make sure this works correctly
    if(error_vectors[0] != nullptr) {
        std::cerr << "Error: the 0th index of error_vector non-null\n";
    }

    for(auto& item : error_vectors) {
        delete item;
    }
}